

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::Duration::ByteSizeLong(Duration *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (this->seconds_ == 0) {
    sVar5 = 0;
  }
  else {
    uVar4 = this->seconds_ | 1;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar5 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  uVar1 = this->nanos_;
  if (uVar1 != 0) {
    if ((int)uVar1 < 0) {
      uVar4 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar1 | 1) != 0) {
        for (; (uVar1 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar4 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    sVar5 = sVar5 + uVar4;
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar5;
    return sVar5;
  }
  sVar5 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar5,
                     &this->_cached_size_);
  return sVar5;
}

Assistant:

size_t Duration::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.Duration)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // int64 seconds = 1;
  if (this->seconds() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64Size(
        this->_internal_seconds());
  }

  // int32 nanos = 2;
  if (this->nanos() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
        this->_internal_nanos());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}